

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O1

PolyNf * __thiscall
Inferences::PolynomialEvaluation::simplifySummation<Kernel::NumTraits<Kernel::RealConstantType>>
          (PolyNf *__return_storage_ptr__,PolynomialEvaluation *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *summands,
          bool removeZeros)

{
  Entry *pEVar1;
  long lVar2;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  *pDVar3;
  long lVar4;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  *pDVar5;
  int iVar6;
  mp_limb_t *pmVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  Entry *pEVar11;
  __mpz_struct *r;
  anon_class_16_2_f84bbffd f;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> monom;
  Numeral numeral;
  int local_17c;
  char local_16c;
  undefined1 local_158 [24];
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *local_140;
  int local_138;
  mp_limb_t *local_130;
  undefined4 local_128 [4];
  __mpz_struct local_118;
  __mpz_struct local_108;
  int local_f8;
  undefined4 uStack_f4;
  mp_limb_t *pmStack_f0;
  RealConstantType local_e8;
  RealConstantType local_c8;
  RationalConstantType local_a8;
  RationalConstantType local_88;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_68;
  AnyPoly local_48;
  
  pEVar11 = (this->_memo)._memo._entries;
  pEVar1 = (this->_memo)._memo._afterLast;
  if (pEVar11 != pEVar1) {
    uVar9 = ((long)pEVar1 - (long)pEVar11 >> 4) * -0x5555555555555555;
    lVar4 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar11,pEVar1,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>*,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar11,pEVar1);
  }
  pEVar11 = (this->_memo)._memo._entries;
  if ((this->_memo)._memo._afterLast == pEVar11) {
    local_17c = 0;
  }
  else {
    uVar9 = 0;
    local_17c = 0;
    do {
      Kernel::RealConstantType::RealConstantType
                ((RealConstantType *)local_158,(RealConstantType *)(&pEVar11->code + uVar9 * 0xc));
      local_138 = *(int *)((long)&pEVar11->_value + uVar9 * 0x30 + 4);
      local_130 = *(mp_limb_t **)((long)&pEVar11->_value + uVar9 * 0x30 + 0xc);
      Kernel::RealConstantType::RealConstantType
                ((RealConstantType *)&local_88,(RealConstantType *)local_158);
      pmVar7 = local_130;
      iVar6 = local_138;
      uVar9 = (ulong)((int)uVar9 + 1);
      pEVar11 = (this->_memo)._memo._entries;
      uVar10 = ((long)(this->_memo)._memo._afterLast - (long)pEVar11 >> 4) * -0x5555555555555555;
      if (uVar9 <= uVar10 && uVar10 - uVar9 != 0) {
        do {
          if (*(int *)((long)&pEVar11->_value + uVar9 * 0x30 + 4) != iVar6) break;
          Kernel::RealConstantType::operator+
                    ((RealConstantType *)&local_118,(RealConstantType *)&local_88,
                     (RealConstantType *)(&pEVar11->code + uVar9 * 0xc));
          mpz_set((__mpz_struct *)&local_88,&local_118);
          mpz_set(local_88._den._val,&local_108);
          mpz_clear(&local_108);
          mpz_clear(&local_118);
          uVar9 = (ulong)((int)uVar9 + 1);
          pEVar11 = (this->_memo)._memo._entries;
          uVar10 = ((long)(this->_memo)._memo._afterLast - (long)pEVar11 >> 4) * -0x5555555555555555
          ;
        } while (uVar9 <= uVar10 && uVar10 - uVar9 != 0);
      }
      bVar8 = true;
      local_16c = (char)summands;
      if (local_16c != '\0') {
        Kernel::RealConstantType::RealConstantType((RealConstantType *)&local_a8,0);
        bVar8 = Kernel::RationalConstantType::operator==(&local_88,&local_a8);
        bVar8 = !bVar8;
        mpz_clear(local_a8._den._val);
        mpz_clear((__mpz_struct *)&local_a8);
      }
      if (bVar8) {
        Kernel::RealConstantType::RealConstantType(&local_c8,(RealConstantType *)&local_88);
        Kernel::RealConstantType::RealConstantType((RealConstantType *)&local_118,&local_c8);
        local_f8 = iVar6;
        pmStack_f0 = pmVar7;
        r = (__mpz_struct *)(&((this->_memo)._memo._entries)->code + (long)local_17c * 0xc);
        mpz_set(r,&local_118);
        mpz_set(r + 1,&local_108);
        r[2]._mp_alloc = local_f8;
        r[2]._mp_size = uStack_f4;
        r[2]._mp_d = pmStack_f0;
        mpz_clear(&local_108);
        mpz_clear(&local_118);
        mpz_clear(local_c8.super_RationalConstantType._den._val);
        mpz_clear((__mpz_struct *)&local_c8);
        local_17c = local_17c + 1;
      }
      mpz_clear(local_88._den._val);
      mpz_clear((__mpz_struct *)&local_88);
      mpz_clear((__mpz_struct *)(local_158 + 0x10));
      mpz_clear((__mpz_struct *)local_158);
      pEVar11 = (this->_memo)._memo._entries;
      uVar10 = ((long)(this->_memo)._memo._afterLast - (long)pEVar11 >> 4) * -0x5555555555555555;
    } while (uVar9 <= uVar10 && uVar10 - uVar9 != 0);
  }
  for (pEVar11 = (Entry *)(&pEVar11->code + (long)local_17c * 0xc);
      pEVar11 != (this->_memo)._memo._afterLast;
      pEVar11 = (Entry *)((pEVar11->_value).__data + 0x14)) {
    mpz_clear((__mpz_struct *)((long)&pEVar11->_key + 0xc));
    mpz_clear((__mpz_struct *)pEVar11);
  }
  pEVar11 = (this->_memo)._memo._entries;
  (this->_memo)._memo._afterLast = (Entry *)((long)&pEVar11->code + (long)local_17c * 0x30);
  if (local_17c == 1) {
    Kernel::RealConstantType::RealConstantType(&local_e8,(RealConstantType *)pEVar11);
    local_158._0_4_ = 1;
    bVar8 = Kernel::operator==(&local_e8,(int *)local_158);
    if ((bVar8) &&
       (lVar4 = *(long *)((long)&((this->_memo)._memo._entries)->_value + 0xc),
       lVar2 = *(long *)(lVar4 + 8),
       (int)((ulong)(*(long *)(lVar4 + 0x10) - lVar2) >> 2) * -0x49249249 == 1)) {
      bVar8 = *(int *)(lVar2 + 0x18) == 1;
      goto LAB_005094af;
    }
  }
  bVar8 = false;
LAB_005094af:
  if (local_17c == 1) {
    mpz_clear(local_e8.super_RationalConstantType._den._val);
    mpz_clear((__mpz_struct *)&local_e8);
  }
  if (bVar8) {
    pDVar3 = *(DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
               **)(*(long *)((long)&((this->_memo)._memo._entries)->_value + 0xc) + 8);
    *(undefined8 *)
     &(__return_storage_ptr__->super_PolyNfSuper)._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
         = 0;
    pDVar5 = &(__return_storage_ptr__->super_PolyNfSuper)._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    ;
    (pDVar5->
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    )._content[7] = '\0';
    (pDVar5->
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    )._content[8] = '\0';
    (pDVar5->
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    )._content[9] = '\0';
    (pDVar5->
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    )._content[10] = '\0';
    (pDVar5->
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    )._content[0xb] = '\0';
    (pDVar5->
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    )._content[0xc] = '\0';
    (pDVar5->
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    )._content[0xd] = '\0';
    (pDVar5->
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    )._content[0xe] = '\0';
    *(undefined8 *)
     ((__return_storage_ptr__->super_PolyNfSuper)._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content + 0xf) = 0;
    *(byte *)&(__return_storage_ptr__->super_PolyNfSuper)._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
              .
              super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
         = *(byte *)&(pDVar3->
                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                     ).
                     super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           & 3;
    f.other = pDVar3;
    f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
              *)__return_storage_ptr__;
    ::Lib::CoproductImpl::
    RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                *)__return_storage_ptr__,f);
  }
  else {
    Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)local_158,
               (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)this);
    local_68._cursor = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)local_158._16_8_;
    local_68._capacity = local_158._0_8_;
    local_158._0_8_ = 0;
    local_68._end = local_140;
    local_140 = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
    local_158._16_8_ = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
    local_68._stack = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)local_158._8_8_;
    local_158._8_8_ = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
    ::Lib::
    perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
              ((Lib *)local_128,(Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_68);
    local_48.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content[7] = '\0';
    local_48.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content._0_4_ = local_128[0];
    local_48.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._0_1_ = 2;
    local_48.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content._4_3_ = 0;
    local_48.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content._8_7_ = SUB87(local_128._8_8_,0);
    local_48.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._content[0xf] = SUB81(local_128._8_8_,7);
    local_48.super_AnyPolySuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ._17_3_ = 0;
    Kernel::PolyNf::PolyNf(__return_storage_ptr__,&local_48);
    ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_68);
    ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack
              ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)local_158);
  }
  return __return_storage_ptr__;
}

Assistant:

PolyNf PolynomialEvaluation::simplifySummation(Stack<Monom<Number>> summands, bool removeZeros)
{ 
  using Monom   = Monom<Number>;
  using Polynom = Polynom<Number>;

  // then we sort them by their monom, in order to add up the coefficients efficiently
  std::sort(summands.begin(), summands.end());

  // add up the coefficients (in place)
  {
    auto offs = 0;
    for (unsigned i = 0; i < summands.size(); i++) { 
      auto monom = summands[i];
      auto numeral = monom.numeral;
      auto factors = monom.factors;
      while ( i + 1 < summands.size() && summands[i+1].factors == factors ) {
        numeral = numeral + summands[i+1].numeral;
        i++;
      }
      if (!removeZeros || numeral != Number::constant(0)) 
        summands[offs++] = Monom(numeral, factors);
    }
    summands.truncate(offs);
  }

  if (summands.size() == 1 
      && summands[0].numeral == 1
      && summands[0].factors->nFactors() == 1
      && summands[0].factors->factorAt(0).power == 1
      ) {
    return summands[0].factors->factorAt(0).term;
  } else {
    auto poly = Polynom(std::move(summands));
    poly.integrity();
    return PolyNf(AnyPoly(perfect(std::move(poly))));
  }
}